

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

void libevent_global_shutdown(void)

{
  void *lock_tmp_;
  
  event_disable_debug_mode();
  if (event_debug_map_lock_ != (void *)0x0) {
    if (evthread_lock_fns_.free != (_func_void_void_ptr_uint *)0x0) {
      (*evthread_lock_fns_.free)(event_debug_map_lock_,0);
    }
    event_debug_map_lock_ = (void *)0x0;
    evthreadimpl_disable_lock_debugging_();
  }
  evsig_free_globals_();
  evutil_free_globals_();
  return;
}

Assistant:

void
libevent_global_shutdown(void)
{
	event_disable_debug_mode();
	event_free_globals();
}